

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.cpp
# Opt level: O2

void __thiscall OpenMD::Inversion::calcForce(Inversion *this,RealType *angle,bool doParticlePot)

{
  RealType *particlePot;
  Atom *pAVar1;
  undefined7 in_register_00000011;
  Vector<double,_3U> *v1;
  Vector<double,_3U> *v1_00;
  double s;
  double dVar2;
  double dVar3;
  RealType dVdcosPhi;
  Vector3d f1;
  Vector3d dcosdB;
  Vector3d A;
  Vector3d r43;
  Vector3d r23;
  Vector3d f3;
  Vector3d f2;
  Vector3d B;
  Vector3d r31;
  Vector3d dcosdA;
  Vector3d pos4;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  double local_200;
  undefined4 local_1f4;
  Vector<double,_3U> local_1f0;
  Vector<double,_3U> local_1d8;
  double local_1c0;
  RealType *local_1b8;
  Vector<double,_3U> local_1b0;
  Vector<double,_3U> local_198;
  Vector<double,_3U> local_180;
  Vector<double,_3U> local_168;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_1f4 = (undefined4)CONCAT71(in_register_00000011,doParticlePot);
  local_1b8 = angle;
  StuntDouble::getPos((Vector3d *)&local_48,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_60,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[2]->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_78,
                      &(*(this->super_ShortRangeInteraction).atoms_.
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_90,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[3]->super_StuntDouble);
  operator-(&local_138,&local_48,&local_78);
  Vector<double,_3U>::Vector(&local_d8,&local_138);
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,
             (Vector3d *)&local_d8);
  operator-(&local_150,&local_78,&local_60);
  Vector<double,_3U>::Vector(&local_138,&local_150);
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,
             (Vector3d *)&local_138);
  operator-(&local_168,&local_78,&local_90);
  Vector<double,_3U>::Vector(&local_150,&local_168);
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,
             (Vector3d *)&local_150);
  cross<double>((Vector3<double> *)&local_168,(Vector3<double> *)&local_d8,
                (Vector3<double> *)&local_150);
  local_1c0 = Vector<double,_3U>::length(&local_168);
  cross<double>((Vector3<double> *)&local_f0,(Vector3<double> *)&local_150,
                (Vector3<double> *)&local_138);
  s = Vector<double,_3U>::length(&local_f0);
  Vector<double,_3U>::normalize(&local_168);
  Vector<double,_3U>::normalize(&local_f0);
  dVar2 = dot<double,3u>(&local_168,&local_f0);
  dVar3 = 1.0;
  if (dVar2 <= 1.0) {
    dVar3 = dVar2;
  }
  dVar2 = -1.0;
  if (-1.0 <= dVar3) {
    dVar2 = dVar3;
  }
  if (this->inversionKey_ == itAngle) {
    acos(dVar2);
    (*this->inversionType_->_vptr_InversionType[2])
              (this->inversionType_,&this->potential_,&local_1b0);
    dVar3 = 1.0 - dVar2 * dVar2;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    local_200 = -local_1b0.data_[0] /
                (double)(~-(ulong)(ABS(dVar3) < 1e-06) & (ulong)dVar3 |
                        -(ulong)(ABS(dVar3) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
  }
  else if (this->inversionKey_ == itCosAngle) {
    (*this->inversionType_->_vptr_InversionType[2])
              (dVar2,this->inversionType_,&this->potential_,&local_200);
  }
  Vector<double,_3U>::Vector(&local_1b0);
  Vector<double,_3U>::Vector(&local_108);
  Vector<double,_3U>::Vector(&local_120);
  operator*(&local_1f0,dVar2,&local_168);
  operator-(&local_1d8,&local_1f0,&local_f0);
  operator/(&local_180,&local_1d8,local_1c0);
  Vector<double,_3U>::Vector(&local_a8,&local_180);
  operator*(&local_198,dVar2,&local_f0);
  operator-(&local_1f0,&local_198,&local_168);
  operator/(&local_1d8,&local_1f0,s);
  Vector<double,_3U>::Vector(&local_180,&local_1d8);
  dVar3 = local_200;
  cross<double>((Vector3<double> *)&local_1f0,(Vector3<double> *)&local_150,
                (Vector3<double> *)&local_a8);
  operator*(&local_1d8,dVar3,&local_1f0);
  Vector3<double>::operator=((Vector3<double> *)&local_1b0,&local_1d8);
  dVar3 = local_200;
  cross<double>((Vector3<double> *)&local_198,(Vector3<double> *)&local_138,
                (Vector3<double> *)&local_180);
  cross<double>((Vector3<double> *)&local_c0,(Vector3<double> *)&local_d8,
                (Vector3<double> *)&local_a8);
  operator-(&local_1f0,&local_198,&local_c0);
  operator*(&local_1d8,dVar3,&local_1f0);
  Vector3<double>::operator=((Vector3<double> *)&local_108,&local_1d8);
  dVar3 = local_200;
  cross<double>((Vector3<double> *)&local_1f0,(Vector3<double> *)&local_180,
                (Vector3<double> *)&local_150);
  operator*(&local_1d8,dVar3,&local_1f0);
  Vector3<double>::operator=((Vector3<double> *)&local_120,&local_1d8);
  StuntDouble::addFrc(&(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble,(Vector3d *)&local_1b0
                     );
  pAVar1 = *(this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  operator-(&local_198,&local_108,&local_1b0);
  operator+(&local_1f0,&local_198,&local_120);
  Vector<double,_3U>::Vector(&local_1d8,&local_1f0);
  StuntDouble::addFrc(&pAVar1->super_StuntDouble,(Vector3d *)&local_1d8);
  pAVar1 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[3];
  operator-(&local_1f0,(OpenMD *)&local_108,v1);
  Vector<double,_3U>::Vector(&local_1d8,&local_1f0);
  StuntDouble::addFrc(&pAVar1->super_StuntDouble,(Vector3d *)&local_1d8);
  pAVar1 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[2];
  operator-(&local_1f0,(OpenMD *)&local_120,v1_00);
  Vector<double,_3U>::Vector(&local_1d8,&local_1f0);
  StuntDouble::addFrc(&pAVar1->super_StuntDouble,(Vector3d *)&local_1d8);
  if ((char)local_1f4 != '\0') {
    particlePot = &this->potential_;
    StuntDouble::addParticlePot
              (&(*(this->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_StuntDouble,particlePot);
    StuntDouble::addParticlePot
              (&(this->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start[1]->super_StuntDouble,particlePot);
    StuntDouble::addParticlePot
              (&(this->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]->super_StuntDouble,particlePot);
    StuntDouble::addParticlePot
              (&(this->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start[3]->super_StuntDouble,particlePot);
  }
  dVar3 = acos(dVar2);
  *local_1b8 = (dVar3 / 3.141592653589793) * 180.0;
  return;
}

Assistant:

void Inversion::calcForce(RealType& angle, bool doParticlePot) {
    // In OpenMD's version of an inversion, the central atom
    // comes first.  However, to get the planarity in a typical cosine
    // version of this potential (i.e. Amber-style), the central atom
    // is treated as atom *3* in a standard torsion form:

    Vector3d pos1 = atoms_[1]->getPos();
    Vector3d pos2 = atoms_[2]->getPos();
    Vector3d pos3 = atoms_[0]->getPos();
    Vector3d pos4 = atoms_[3]->getPos();

    Vector3d r31 = pos1 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r31);
    Vector3d r23 = pos3 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r23);
    Vector3d r43 = pos3 - pos4;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r43);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r31, r43);
    RealType rA = A.length();
    Vector3d B  = cross(r43, r23);
    RealType rB = B.length();

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);
    if (cos_phi > 1.0) cos_phi = 1.0;
    if (cos_phi < -1.0) cos_phi = -1.0;

    RealType dVdcosPhi;
    switch (inversionKey_) {
    case itCosAngle:
      inversionType_->calcForce(cos_phi, potential_, dVdcosPhi);
      break;
    case itAngle:
      RealType phi = acos(cos_phi);
      RealType dVdPhi;
      inversionType_->calcForce(phi, potential_, dVdPhi);
      RealType sin_phi = sqrt(1.0 - cos_phi * cos_phi);
      if (fabs(sin_phi) < 1.0E-6) { sin_phi = 1.0E-6; }
      dVdcosPhi = -dVdPhi / sin_phi;

      break;
    }

    Vector3d f1;
    Vector3d f2;
    Vector3d f3;

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    f1 = dVdcosPhi * cross(r43, dcosdA);
    f2 = dVdcosPhi * (cross(r23, dcosdB) - cross(r31, dcosdA));
    f3 = dVdcosPhi * cross(dcosdB, r43);

    // In OpenMD's version of an improper torsion, the central atom
    // comes first.  However, to get the planarity in a typical cosine
    // version of this potential (i.e. Amber-style), the central atom
    // is treated as atom *3* in a standard torsion form:

    //  AMBER:   I - J - K - L   (e.g. K is sp2 hybridized carbon)
    //  OpenMD:  I - (J - K - L)  (e.g. I is sp2 hybridized carbon)

    // Confusing enough?  Good.

    atoms_[1]->addFrc(f1);
    atoms_[0]->addFrc(f2 - f1 + f3);
    atoms_[3]->addFrc(-f2);
    atoms_[2]->addFrc(-f3);

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      atoms_[2]->addParticlePot(potential_);
      atoms_[3]->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }